

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

char * getcontent(xmlNode *attr)

{
  xmlChar *pxVar1;
  _xmlNode *p_Var2;
  size_t sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  long lVar6;
  _xmlNode *p_Var7;
  char *__dest;
  char *pcVar8;
  xmlChar *__s;
  char *pcVar9;
  
  p_Var2 = attr->children;
  if (p_Var2 == (_xmlNode *)0x0) {
    pcVar4 = (char *)malloc(1);
    __dest = pcVar4;
  }
  else {
    lVar6 = 0;
    p_Var7 = p_Var2;
    do {
      if (p_Var7->type == XML_TEXT_NODE) {
        sVar3 = strlen((char *)p_Var7->content);
        lVar6 = lVar6 + sVar3;
      }
      p_Var7 = p_Var7->next;
    } while (p_Var7 != (_xmlNode *)0x0);
    pcVar4 = (char *)malloc(lVar6 + 1);
    __dest = pcVar4;
    for (; p_Var2 != (_xmlNode *)0x0; p_Var2 = p_Var2->next) {
      if (p_Var2->type == XML_TEXT_NODE) {
        __s = p_Var2->content;
        if (__dest == pcVar4) {
          ppuVar5 = __ctype_b_loc();
          __s = __s + -1;
          do {
            pxVar1 = __s + 1;
            __s = __s + 1;
          } while ((*(byte *)((long)*ppuVar5 + (long)(char)*pxVar1 * 2 + 1) & 0x20) != 0);
        }
        sVar3 = strlen((char *)__s);
        memcpy(__dest,__s,sVar3);
        __dest = __dest + sVar3;
      }
    }
  }
  do {
    pcVar8 = __dest;
    pcVar9 = pcVar4;
    if (pcVar8 == pcVar4) break;
    ppuVar5 = __ctype_b_loc();
    __dest = pcVar8 + -1;
    pcVar9 = pcVar8;
  } while ((*(byte *)((long)*ppuVar5 + (long)pcVar8[-1] * 2 + 1) & 0x20) != 0);
  *pcVar9 = '\0';
  return pcVar4;
}

Assistant:

static char *getcontent (xmlNode *attr) {
	xmlNode *chain = attr->children;
	size_t size = 0;
	char *content, *p;
	while (chain) {
		if (chain->type == XML_TEXT_NODE)
			size += strlen(chain->content);
		chain = chain->next;
	}
	p = content = malloc(size + 1);
	chain = attr->children;
	while (chain) {
		if (chain->type == XML_TEXT_NODE) {
			char* sp = chain->content;
			if(p == content) {
				while(isspace(*sp))
					++sp;
			}
			size_t len = strlen(sp);
			memcpy(p, sp, len);
			p += len;
		}
		chain = chain->next;
	}
	while(p != content && isspace(p[-1]))
		--p;
	*p = 0;
	return content;
}